

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::sse42::
     BVHNIntersector1<4,_1048576,_false,_embree::sse42::ArrayIntersector1<embree::sse42::TriangleMiIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  ulong uVar9;
  ulong uVar10;
  undefined8 *puVar11;
  undefined8 uVar12;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar13;
  float **ppfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  byte bVar23;
  byte bVar24;
  byte bVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  byte bVar31;
  int iVar32;
  BaseNode *node;
  ulong uVar33;
  long lVar34;
  uint uVar35;
  byte bVar36;
  undefined4 uVar37;
  ulong *puVar38;
  Ray *pRVar39;
  RayQueryContext *pRVar40;
  ulong uVar41;
  ulong uVar42;
  float fVar43;
  float fVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar54;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  byte bVar55;
  float fVar56;
  byte bVar60;
  byte bVar61;
  byte bVar62;
  byte bVar63;
  float fVar64;
  byte bVar65;
  byte bVar66;
  float fVar67;
  undefined1 auVar57 [16];
  float fVar68;
  float fVar69;
  float fVar70;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar71;
  uint uVar72;
  float fVar73;
  uint uVar78;
  float fVar79;
  uint uVar80;
  float fVar81;
  vint4 ai_1;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar82;
  uint uVar83;
  uint uVar84;
  float fVar85;
  uint uVar89;
  float fVar90;
  uint uVar91;
  vint4 bi;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  uint uVar92;
  undefined1 auVar88 [16];
  float fVar93;
  uint uVar94;
  float fVar95;
  uint uVar96;
  float fVar97;
  uint uVar98;
  float fVar99;
  uint uVar100;
  uint uVar101;
  uint uVar104;
  uint uVar105;
  vint4 ai;
  undefined1 auVar102 [16];
  float fVar106;
  uint uVar107;
  undefined1 auVar103 [16];
  float fVar108;
  float fVar112;
  float fVar113;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar114;
  float fVar117;
  float fVar118;
  float fVar119;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar120;
  float fVar122;
  float fVar123;
  float fVar124;
  undefined1 auVar121 [16];
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 auVar134 [16];
  float fVar138;
  float fVar140;
  undefined1 auVar139 [16];
  float fVar141;
  float fVar142;
  float fVar143;
  undefined1 auVar144 [16];
  float fVar145;
  float fVar146;
  UVIdentity<4> mapUV;
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  undefined1 local_a99;
  RTCIntersectArguments *local_a98;
  float fStack_a90;
  float fStack_a8c;
  int local_a7c;
  undefined8 local_a78;
  float fStack_a70;
  float fStack_a6c;
  undefined8 local_a68;
  float fStack_a60;
  float fStack_a5c;
  Scene *local_a50;
  undefined8 local_a48;
  float fStack_a40;
  float fStack_a3c;
  undefined8 local_a38;
  float fStack_a30;
  float fStack_a2c;
  float local_a28;
  float fStack_a24;
  float fStack_a20;
  float fStack_a1c;
  undefined8 local_a18;
  float fStack_a10;
  float fStack_a0c;
  undefined8 local_a08;
  float fStack_a00;
  float fStack_9fc;
  undefined8 local_9f8;
  float fStack_9f0;
  float fStack_9ec;
  ulong local_9e8;
  ulong local_9e0;
  undefined4 local_9d8;
  undefined4 local_9d4;
  undefined4 local_9d0;
  undefined4 local_9cc;
  undefined4 local_9c8;
  undefined4 local_9c4;
  uint local_9c0;
  uint local_9bc;
  uint local_9b8;
  RTCFilterFunctionNArguments local_9a8;
  float local_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float local_968;
  float fStack_964;
  float fStack_960;
  float fStack_95c;
  float local_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float local_948;
  float fStack_944;
  float fStack_940;
  float fStack_93c;
  float local_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float local_928;
  float fStack_924;
  float fStack_920;
  float fStack_91c;
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float local_908;
  float fStack_904;
  float fStack_900;
  float fStack_8fc;
  float local_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float local_8e8;
  float fStack_8e4;
  float fStack_8e0;
  float fStack_8dc;
  float local_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float local_8c8;
  float fStack_8c4;
  float fStack_8c0;
  float fStack_8bc;
  undefined1 local_8b8 [16];
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  undefined1 local_868 [16];
  undefined1 *local_858;
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  ulong local_7d8;
  ulong local_7d0 [244];
  undefined1 auVar49 [16];
  
  local_7d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if ((local_7d8 != 8) && (local_908 = ray->tfar, 0.0 <= local_908)) {
    local_9f8 = local_7d0;
    local_948 = (ray->org).field_0.m128[0];
    local_958 = (ray->org).field_0.m128[1];
    local_918 = (ray->org).field_0.m128[2];
    fVar54 = *(float *)((long)&(ray->org).field_0 + 0xc);
    aVar13 = (ray->dir).field_0.field_1;
    auVar45._4_4_ = -(uint)(ABS(aVar13.y) < DAT_01f80d30._4_4_);
    auVar45._0_4_ = -(uint)(ABS(aVar13.x) < (float)DAT_01f80d30);
    auVar45._8_4_ = -(uint)(ABS(aVar13.z) < DAT_01f80d30._8_4_);
    auVar45._12_4_ = -(uint)(ABS(aVar13.field_3.w) < DAT_01f80d30._12_4_);
    auVar74 = blendvps((undefined1  [16])aVar13,_DAT_01f80d30,auVar45);
    local_928 = 0.0;
    if (0.0 <= fVar54) {
      local_928 = fVar54;
    }
    auVar45 = rcpps(auVar45,auVar74);
    local_968 = auVar45._0_4_;
    local_978 = auVar45._4_4_;
    local_938 = auVar45._8_4_;
    local_968 = (1.0 - auVar74._0_4_ * local_968) * local_968 + local_968;
    local_978 = (1.0 - auVar74._4_4_ * local_978) * local_978 + local_978;
    local_938 = (1.0 - auVar74._8_4_ * local_938) * local_938 + local_938;
    local_a08 = (ulong)(local_968 < 0.0) << 2;
    uVar9 = (ulong)(local_978 < 0.0) * 4 + 8;
    local_9e0 = (ulong)(local_938 < 0.0);
    uVar10 = local_9e0 * 4 + 0x10;
    uVar41 = local_a08 ^ 4;
    local_8b8 = mm_lookupmask_ps._240_16_;
    local_a48 = ray;
    local_a68 = context;
    fStack_924 = local_928;
    fStack_920 = local_928;
    fStack_91c = local_928;
    fStack_934 = local_938;
    fStack_930 = local_938;
    fStack_92c = local_938;
    fStack_964 = local_968;
    fStack_960 = local_968;
    fStack_95c = local_968;
    fStack_904 = local_908;
    fStack_900 = local_908;
    fStack_8fc = local_908;
    fStack_914 = local_918;
    fStack_910 = local_918;
    fStack_90c = local_918;
    fStack_944 = local_948;
    fStack_940 = local_948;
    fStack_93c = local_948;
    fStack_954 = local_958;
    fStack_950 = local_958;
    fStack_94c = local_958;
    fStack_974 = local_978;
    fStack_970 = local_978;
    fStack_96c = local_978;
    do {
      uVar42 = local_9f8[-1];
      local_9f8 = local_9f8 + -1;
      while ((uVar42 & 8) == 0) {
        uVar33 = uVar42 & 0xfffffffffffffff0;
        puVar38 = (ulong *)(uVar33 + 0x20);
        if (uVar33 == 0) {
          puVar38 = (ulong *)0x0;
        }
        uVar42 = *puVar38;
        auVar46._8_8_ = 0;
        auVar46._0_8_ = uVar42;
        uVar12 = *(undefined8 *)((long)puVar38 + 4);
        bVar36 = (byte)uVar42;
        bVar55 = (byte)uVar12;
        bVar19 = (byte)(uVar42 >> 8);
        bVar60 = (byte)((ulong)uVar12 >> 8);
        bVar20 = (byte)(uVar42 >> 0x10);
        bVar61 = (byte)((ulong)uVar12 >> 0x10);
        bVar21 = (byte)(uVar42 >> 0x18);
        bVar62 = (byte)((ulong)uVar12 >> 0x18);
        bVar22 = (byte)(uVar42 >> 0x20);
        bVar63 = (byte)((ulong)uVar12 >> 0x20);
        bVar23 = (byte)(uVar42 >> 0x28);
        bVar65 = (byte)((ulong)uVar12 >> 0x28);
        bVar24 = (byte)(uVar42 >> 0x30);
        bVar66 = (byte)((ulong)uVar12 >> 0x30);
        bVar31 = (byte)((ulong)uVar12 >> 0x38);
        bVar25 = (byte)(uVar42 >> 0x38);
        auVar57[0] = -((byte)((bVar36 < bVar55) * bVar36 | (bVar36 >= bVar55) * bVar55) == bVar36);
        auVar57[1] = -((byte)((bVar19 < bVar60) * bVar19 | (bVar19 >= bVar60) * bVar60) == bVar19);
        auVar57[2] = -((byte)((bVar20 < bVar61) * bVar20 | (bVar20 >= bVar61) * bVar61) == bVar20);
        auVar57[3] = -((byte)((bVar21 < bVar62) * bVar21 | (bVar21 >= bVar62) * bVar62) == bVar21);
        auVar57[4] = -((byte)((bVar22 < bVar63) * bVar22 | (bVar22 >= bVar63) * bVar63) == bVar22);
        auVar57[5] = -((byte)((bVar23 < bVar65) * bVar23 | (bVar23 >= bVar65) * bVar65) == bVar23);
        auVar57[6] = -((byte)((bVar24 < bVar66) * bVar24 | (bVar24 >= bVar66) * bVar66) == bVar24);
        auVar57[7] = -((byte)((bVar25 < bVar31) * bVar25 | (bVar25 >= bVar31) * bVar31) == bVar25);
        auVar57[8] = 0xff;
        auVar57[9] = 0xff;
        auVar57[10] = 0xff;
        auVar57[0xb] = 0xff;
        auVar57[0xc] = 0xff;
        auVar57[0xd] = 0xff;
        auVar57[0xe] = 0xff;
        auVar57[0xf] = 0xff;
        auVar74._8_4_ = 0xffffffff;
        auVar74._0_8_ = 0xffffffffffffffff;
        auVar74._12_4_ = 0xffffffff;
        auVar45 = pmovzxbd(auVar46,auVar57 ^ auVar74);
        auVar76._8_4_ = 0xffffffff;
        auVar76._0_8_ = 0xffffffffffffffff;
        auVar76._12_4_ = 0xffffffff;
        auVar45 = auVar45 ^ auVar76;
        auVar87._0_4_ = auVar45._0_4_ << 0x1f;
        auVar87._4_4_ = auVar45._4_4_ << 0x1f;
        auVar87._8_4_ = auVar45._8_4_ << 0x1f;
        auVar87._12_4_ = auVar45._12_4_ << 0x1f;
        uVar35 = movmskps((int)local_9e0,auVar87);
        local_9e0 = (ulong)uVar35;
        fVar54 = *(float *)(puVar38 + 3);
        fVar82 = *(float *)((long)puVar38 + 0x1c);
        fVar71 = *(float *)((long)puVar38 + 0x24);
        auVar47._8_8_ = 0;
        auVar47._0_8_ = *(ulong *)((long)puVar38 + local_a08);
        auVar45 = pmovzxbd(auVar47,auVar47);
        auVar48._8_8_ = 0;
        auVar48._0_8_ = *(ulong *)((long)puVar38 + uVar41);
        auVar74 = pmovzxbd(auVar48,auVar48);
        fVar106 = *(float *)(puVar38 + 5);
        auVar75._8_8_ = 0;
        auVar75._0_8_ = *(ulong *)((long)puVar38 + uVar9);
        auVar76 = pmovzxbd(auVar75,auVar75);
        auVar77._8_8_ = 0;
        auVar77._0_8_ = *(ulong *)((long)puVar38 + (uVar9 ^ 4));
        auVar46 = pmovzxbd(auVar77,auVar77);
        fVar43 = *(float *)((long)puVar38 + 0x2c);
        auVar86._8_8_ = 0;
        auVar86._0_8_ = *(ulong *)((long)puVar38 + uVar10);
        auVar87 = pmovzxbd(auVar86,auVar86);
        auVar102._8_8_ = 0;
        auVar102._0_8_ = *(ulong *)((long)puVar38 + (uVar10 ^ 4));
        auVar47 = pmovzxbd(auVar102,auVar102);
        fVar44 = *(float *)(puVar38 + 4);
        fVar56 = (((float)auVar45._0_4_ * fVar71 + fVar54) - local_948) * local_968;
        fVar64 = (((float)auVar45._4_4_ * fVar71 + fVar54) - fStack_944) * fStack_964;
        fVar67 = (((float)auVar45._8_4_ * fVar71 + fVar54) - fStack_940) * fStack_960;
        fVar69 = (((float)auVar45._12_4_ * fVar71 + fVar54) - fStack_93c) * fStack_95c;
        fVar93 = (((float)auVar76._0_4_ * fVar106 + fVar82) - local_958) * local_978;
        fVar95 = (((float)auVar76._4_4_ * fVar106 + fVar82) - fStack_954) * fStack_974;
        fVar97 = (((float)auVar76._8_4_ * fVar106 + fVar82) - fStack_950) * fStack_970;
        fVar99 = (((float)auVar76._12_4_ * fVar106 + fVar82) - fStack_94c) * fStack_96c;
        uVar94 = (uint)((int)fVar93 < (int)fVar56) * (int)fVar56 |
                 (uint)((int)fVar93 >= (int)fVar56) * (int)fVar93;
        uVar96 = (uint)((int)fVar95 < (int)fVar64) * (int)fVar64 |
                 (uint)((int)fVar95 >= (int)fVar64) * (int)fVar95;
        uVar98 = (uint)((int)fVar97 < (int)fVar67) * (int)fVar67 |
                 (uint)((int)fVar97 >= (int)fVar67) * (int)fVar97;
        uVar100 = (uint)((int)fVar99 < (int)fVar69) * (int)fVar69 |
                  (uint)((int)fVar99 >= (int)fVar69) * (int)fVar99;
        fVar56 = (((float)auVar87._0_4_ * fVar43 + fVar44) - local_918) * local_938;
        fVar64 = (((float)auVar87._4_4_ * fVar43 + fVar44) - fStack_914) * fStack_934;
        fVar67 = (((float)auVar87._8_4_ * fVar43 + fVar44) - fStack_910) * fStack_930;
        fVar69 = (((float)auVar87._12_4_ * fVar43 + fVar44) - fStack_90c) * fStack_92c;
        uVar84 = (uint)((int)fVar56 < (int)local_928) * (int)local_928 |
                 (uint)((int)fVar56 >= (int)local_928) * (int)fVar56;
        uVar89 = (uint)((int)fVar64 < (int)fStack_924) * (int)fStack_924 |
                 (uint)((int)fVar64 >= (int)fStack_924) * (int)fVar64;
        uVar91 = (uint)((int)fVar67 < (int)fStack_920) * (int)fStack_920 |
                 (uint)((int)fVar67 >= (int)fStack_920) * (int)fVar67;
        uVar92 = (uint)((int)fVar69 < (int)fStack_91c) * (int)fStack_91c |
                 (uint)((int)fVar69 >= (int)fStack_91c) * (int)fVar69;
        fVar56 = (((float)auVar74._0_4_ * fVar71 + fVar54) - local_948) * local_968;
        fVar64 = (((float)auVar74._4_4_ * fVar71 + fVar54) - fStack_944) * fStack_964;
        fVar67 = (((float)auVar74._8_4_ * fVar71 + fVar54) - fStack_940) * fStack_960;
        fVar54 = (((float)auVar74._12_4_ * fVar71 + fVar54) - fStack_93c) * fStack_95c;
        fVar71 = (((float)auVar46._0_4_ * fVar106 + fVar82) - local_958) * local_978;
        fVar69 = (((float)auVar46._4_4_ * fVar106 + fVar82) - fStack_954) * fStack_974;
        fVar93 = (((float)auVar46._8_4_ * fVar106 + fVar82) - fStack_950) * fStack_970;
        fVar82 = (((float)auVar46._12_4_ * fVar106 + fVar82) - fStack_94c) * fStack_96c;
        uVar72 = (uint)((int)fVar56 < (int)fVar71) * (int)fVar56 |
                 (uint)((int)fVar56 >= (int)fVar71) * (int)fVar71;
        uVar78 = (uint)((int)fVar64 < (int)fVar69) * (int)fVar64 |
                 (uint)((int)fVar64 >= (int)fVar69) * (int)fVar69;
        uVar80 = (uint)((int)fVar67 < (int)fVar93) * (int)fVar67 |
                 (uint)((int)fVar67 >= (int)fVar93) * (int)fVar93;
        uVar83 = (uint)((int)fVar54 < (int)fVar82) * (int)fVar54 |
                 (uint)((int)fVar54 >= (int)fVar82) * (int)fVar82;
        fVar54 = (((float)auVar47._0_4_ * fVar43 + fVar44) - local_918) * local_938;
        fVar82 = (((float)auVar47._4_4_ * fVar43 + fVar44) - fStack_914) * fStack_934;
        fVar71 = (((float)auVar47._8_4_ * fVar43 + fVar44) - fStack_910) * fStack_930;
        fVar106 = (((float)auVar47._12_4_ * fVar43 + fVar44) - fStack_90c) * fStack_92c;
        uVar101 = (uint)((int)local_908 < (int)fVar54) * (int)local_908 |
                  (uint)((int)local_908 >= (int)fVar54) * (int)fVar54;
        uVar104 = (uint)((int)fStack_904 < (int)fVar82) * (int)fStack_904 |
                  (uint)((int)fStack_904 >= (int)fVar82) * (int)fVar82;
        uVar105 = (uint)((int)fStack_900 < (int)fVar71) * (int)fStack_900 |
                  (uint)((int)fStack_900 >= (int)fVar71) * (int)fVar71;
        uVar107 = (uint)((int)fStack_8fc < (int)fVar106) * (int)fStack_8fc |
                  (uint)((int)fStack_8fc >= (int)fVar106) * (int)fVar106;
        auVar88._0_4_ =
             -(uint)((int)(((int)uVar72 < (int)uVar101) * uVar72 |
                          ((int)uVar72 >= (int)uVar101) * uVar101) <
                    (int)(((int)uVar84 < (int)uVar94) * uVar94 |
                         ((int)uVar84 >= (int)uVar94) * uVar84));
        auVar88._4_4_ =
             -(uint)((int)(((int)uVar78 < (int)uVar104) * uVar78 |
                          ((int)uVar78 >= (int)uVar104) * uVar104) <
                    (int)(((int)uVar89 < (int)uVar96) * uVar96 |
                         ((int)uVar89 >= (int)uVar96) * uVar89));
        auVar88._8_4_ =
             -(uint)((int)(((int)uVar80 < (int)uVar105) * uVar80 |
                          ((int)uVar80 >= (int)uVar105) * uVar105) <
                    (int)(((int)uVar91 < (int)uVar98) * uVar98 |
                         ((int)uVar91 >= (int)uVar98) * uVar91));
        auVar88._12_4_ =
             -(uint)((int)(((int)uVar83 < (int)uVar107) * uVar83 |
                          ((int)uVar83 >= (int)uVar107) * uVar107) <
                    (int)(((int)uVar92 < (int)uVar100) * uVar100 |
                         ((int)uVar92 >= (int)uVar100) * uVar92));
        uVar37 = movmskps((int)puVar38,auVar88);
        bVar36 = ~(byte)uVar37 & (byte)uVar35;
        if (bVar36 == 0) goto LAB_0022a8a6;
        local_9e0 = (ulong)bVar36;
        lVar34 = 0;
        if (local_9e0 != 0) {
          for (; (bVar36 >> lVar34 & 1) == 0; lVar34 = lVar34 + 1) {
          }
        }
        uVar42 = *(ulong *)(uVar33 + lVar34 * 8);
        uVar35 = bVar36 - 1 & (uint)bVar36;
        if (uVar35 != 0) {
          *local_9f8 = uVar42;
          local_9f8 = local_9f8 + 1;
          lVar34 = 0;
          if (uVar35 != 0) {
            for (; (uVar35 >> lVar34 & 1) == 0; lVar34 = lVar34 + 1) {
            }
          }
          uVar42 = *(ulong *)(uVar33 + lVar34 * 8);
          uVar35 = uVar35 - 1 & uVar35;
          local_9e0 = (ulong)uVar35;
          if (uVar35 != 0) {
            do {
              *local_9f8 = uVar42;
              local_9f8 = local_9f8 + 1;
              lVar34 = 0;
              if (local_9e0 != 0) {
                for (; (local_9e0 >> lVar34 & 1) == 0; lVar34 = lVar34 + 1) {
                }
              }
              uVar42 = *(ulong *)(uVar33 + lVar34 * 8);
              local_9e0 = local_9e0 & local_9e0 - 1;
            } while (local_9e0 != 0);
          }
        }
      }
      local_9e8 = (ulong)((uint)uVar42 & 0xf) - 8;
      if (local_9e8 != 0) {
        uVar42 = uVar42 & 0xfffffffffffffff0;
        local_9e0 = 0;
        local_a50 = local_a68->scene;
        pRVar39 = local_a48;
        pRVar40 = local_a68;
        puVar38 = local_9f8;
        uVar33 = local_a08;
        do {
          lVar34 = local_9e0 * 0x50;
          ppfVar14 = (local_a50->vertices).items;
          pfVar15 = ppfVar14[*(uint *)(uVar42 + 0x30 + lVar34)];
          pfVar1 = pfVar15 + *(uint *)(uVar42 + lVar34);
          pfVar2 = pfVar15 + *(uint *)(uVar42 + 0x10 + lVar34);
          pfVar15 = pfVar15 + *(uint *)(uVar42 + 0x20 + lVar34);
          pfVar16 = ppfVar14[*(uint *)(uVar42 + 0x34 + lVar34)];
          pfVar3 = pfVar16 + *(uint *)(uVar42 + 4 + lVar34);
          pfVar4 = pfVar16 + *(uint *)(uVar42 + 0x14 + lVar34);
          pfVar16 = pfVar16 + *(uint *)(uVar42 + 0x24 + lVar34);
          pfVar17 = ppfVar14[*(uint *)(uVar42 + 0x38 + lVar34)];
          pfVar5 = pfVar17 + *(uint *)(uVar42 + 8 + lVar34);
          pfVar6 = pfVar17 + *(uint *)(uVar42 + 0x18 + lVar34);
          pfVar17 = pfVar17 + *(uint *)(uVar42 + 0x28 + lVar34);
          pfVar18 = ppfVar14[*(uint *)(uVar42 + 0x3c + lVar34)];
          pfVar7 = pfVar18 + *(uint *)(uVar42 + 0xc + lVar34);
          pfVar8 = pfVar18 + *(uint *)(uVar42 + 0x1c + lVar34);
          pfVar18 = pfVar18 + *(uint *)(uVar42 + 0x2c + lVar34);
          puVar11 = (undefined8 *)(uVar42 + 0x30 + lVar34);
          local_898 = *puVar11;
          uStack_890 = puVar11[1];
          puVar11 = (undefined8 *)(uVar42 + 0x40 + lVar34);
          local_8a8 = *puVar11;
          uStack_8a0 = puVar11[1];
          fVar54 = (pRVar39->org).field_0.m128[0];
          fVar82 = (pRVar39->org).field_0.m128[1];
          fVar71 = (pRVar39->org).field_0.m128[2];
          fVar93 = *pfVar1 - fVar54;
          fVar97 = *pfVar3 - fVar54;
          fStack_a00 = *pfVar5 - fVar54;
          fStack_9fc = *pfVar7 - fVar54;
          fVar138 = pfVar1[1] - fVar82;
          fVar140 = pfVar3[1] - fVar82;
          fStack_a10 = pfVar5[1] - fVar82;
          fStack_a0c = pfVar7[1] - fVar82;
          fVar145 = pfVar1[2] - fVar71;
          fVar146 = pfVar3[2] - fVar71;
          fStack_9f0 = pfVar5[2] - fVar71;
          fStack_9ec = pfVar7[2] - fVar71;
          fVar43 = *pfVar2 - fVar54;
          fVar56 = *pfVar4 - fVar54;
          fVar67 = *pfVar6 - fVar54;
          fVar69 = *pfVar8 - fVar54;
          fVar133 = pfVar2[1] - fVar82;
          fVar135 = pfVar4[1] - fVar82;
          fVar136 = pfVar6[1] - fVar82;
          fVar137 = pfVar8[1] - fVar82;
          fVar129 = pfVar2[2] - fVar71;
          fVar130 = pfVar4[2] - fVar71;
          fVar131 = pfVar6[2] - fVar71;
          fVar132 = pfVar8[2] - fVar71;
          fVar141 = *pfVar15 - fVar54;
          fVar142 = *pfVar16 - fVar54;
          fVar143 = *pfVar17 - fVar54;
          fVar54 = *pfVar18 - fVar54;
          fVar73 = pfVar15[1] - fVar82;
          fVar79 = pfVar16[1] - fVar82;
          fVar81 = pfVar17[1] - fVar82;
          fVar82 = pfVar18[1] - fVar82;
          fVar108 = pfVar15[2] - fVar71;
          fVar112 = pfVar16[2] - fVar71;
          fVar113 = pfVar17[2] - fVar71;
          fVar71 = pfVar18[2] - fVar71;
          fVar114 = fVar141 - fVar93;
          fVar117 = fVar142 - fVar97;
          fVar118 = fVar143 - fStack_a00;
          fVar119 = fVar54 - fStack_9fc;
          fVar125 = fVar73 - fVar138;
          fVar127 = fVar79 - fVar140;
          fStack_a30 = fVar81 - fStack_a10;
          fStack_a2c = fVar82 - fStack_a0c;
          local_a28 = fVar108 - fVar145;
          fStack_a24 = fVar112 - fVar146;
          fStack_a20 = fVar113 - fStack_9f0;
          fStack_a1c = fVar71 - fStack_9ec;
          local_a38 = (Geometry *)CONCAT44(fVar127,fVar125);
          local_a78 = CONCAT44(fVar117,fVar114);
          fStack_a70 = fVar118;
          fStack_a6c = fVar119;
          fVar106 = (pRVar39->dir).field_0.m128[0];
          fStack_a90 = (pRVar39->dir).field_0.m128[1];
          fStack_a60 = (pRVar39->dir).field_0.m128[2];
          fVar44 = (fVar125 * (fVar108 + fVar145) - local_a28 * (fVar73 + fVar138)) * fVar106 +
                   (local_a28 * (fVar141 + fVar93) - (fVar108 + fVar145) * fVar114) * fStack_a90 +
                   ((fVar73 + fVar138) * fVar114 - (fVar141 + fVar93) * fVar125) * fStack_a60;
          fVar64 = (fVar127 * (fVar112 + fVar146) - fStack_a24 * (fVar79 + fVar140)) * fVar106 +
                   (fStack_a24 * (fVar142 + fVar97) - (fVar112 + fVar146) * fVar117) * fStack_a90 +
                   ((fVar79 + fVar140) * fVar117 - (fVar142 + fVar97) * fVar127) * fStack_a60;
          auVar49._0_8_ = CONCAT44(fVar64,fVar44);
          auVar49._8_4_ =
               (fStack_a30 * (fVar113 + fStack_9f0) - fStack_a20 * (fVar81 + fStack_a10)) * fVar106
               + (fStack_a20 * (fVar143 + fStack_a00) - (fVar113 + fStack_9f0) * fVar118) *
                 fStack_a90 +
                 ((fVar81 + fStack_a10) * fVar118 - (fVar143 + fStack_a00) * fStack_a30) *
                 fStack_a60;
          auVar49._12_4_ =
               (fStack_a2c * (fVar71 + fStack_9ec) - fStack_a1c * (fVar82 + fStack_a0c)) * fVar106 +
               (fStack_a1c * (fVar54 + fStack_9fc) - (fVar71 + fStack_9ec) * fVar119) * fStack_a90 +
               ((fVar82 + fStack_a0c) * fVar119 - (fVar54 + fStack_9fc) * fStack_a2c) * fStack_a60;
          fVar85 = fVar138 - fVar133;
          fVar90 = fVar140 - fVar135;
          fStack_a40 = fStack_a10 - fVar136;
          fStack_a3c = fStack_a0c - fVar137;
          fVar120 = fVar145 - fVar129;
          fVar122 = fVar146 - fVar130;
          fVar123 = fStack_9f0 - fVar131;
          fVar124 = fStack_9ec - fVar132;
          local_a18 = CONCAT44(fVar140,fVar138);
          local_9f8 = (ulong *)CONCAT44(fVar146,fVar145);
          local_a48 = (Ray *)CONCAT44(fVar90,fVar85);
          fVar95 = fVar93 - fVar43;
          fVar99 = fVar97 - fVar56;
          fVar68 = fStack_a00 - fVar67;
          fVar70 = fStack_9fc - fVar69;
          local_a08 = CONCAT44(fVar97,fVar93);
          local_8c8 = (fVar85 * (fVar145 + fVar129) - fVar120 * (fVar138 + fVar133)) * fVar106 +
                      (fVar120 * (fVar93 + fVar43) - (fVar145 + fVar129) * fVar95) * fStack_a90 +
                      ((fVar138 + fVar133) * fVar95 - (fVar93 + fVar43) * fVar85) * fStack_a60;
          fStack_8c4 = (fVar90 * (fVar146 + fVar130) - fVar122 * (fVar140 + fVar135)) * fVar106 +
                       (fVar122 * (fVar97 + fVar56) - (fVar146 + fVar130) * fVar99) * fStack_a90 +
                       ((fVar140 + fVar135) * fVar99 - (fVar97 + fVar56) * fVar90) * fStack_a60;
          fStack_8c0 = (fStack_a40 * (fStack_9f0 + fVar131) - fVar123 * (fStack_a10 + fVar136)) *
                       fVar106 + (fVar123 * (fStack_a00 + fVar67) - (fStack_9f0 + fVar131) * fVar68)
                                 * fStack_a90 +
                                 ((fStack_a10 + fVar136) * fVar68 -
                                 (fStack_a00 + fVar67) * fStack_a40) * fStack_a60;
          fStack_8bc = (fStack_a3c * (fStack_9ec + fVar132) - fVar124 * (fStack_a0c + fVar137)) *
                       fVar106 + (fVar124 * (fStack_9fc + fVar69) - (fStack_9ec + fVar132) * fVar70)
                                 * fStack_a90 +
                                 ((fStack_a0c + fVar137) * fVar70 -
                                 (fStack_9fc + fVar69) * fStack_a3c) * fStack_a60;
          local_8e8 = fVar43 - fVar141;
          fStack_8e4 = fVar56 - fVar142;
          fStack_8e0 = fVar67 - fVar143;
          fStack_8dc = fVar69 - fVar54;
          fVar126 = fVar133 - fVar73;
          fVar128 = fVar135 - fVar79;
          fStack_a70 = fVar136 - fVar81;
          fStack_a6c = fVar137 - fVar82;
          local_8f8 = fVar129 - fVar108;
          fStack_8f4 = fVar130 - fVar112;
          fStack_8f0 = fVar131 - fVar113;
          fStack_8ec = fVar132 - fVar71;
          local_a68 = (RayQueryContext *)CONCAT44(fStack_a60,fStack_a60);
          fStack_a5c = fStack_a60;
          local_888._8_4_ = auVar49._8_4_;
          local_888._0_8_ = auVar49._0_8_;
          local_888._12_4_ = auVar49._12_4_;
          auVar58._0_4_ =
               (fVar126 * (fVar108 + fVar129) - local_8f8 * (fVar73 + fVar133)) * fVar106 +
               (local_8f8 * (fVar141 + fVar43) - (fVar108 + fVar129) * local_8e8) * fStack_a90 +
               ((fVar73 + fVar133) * local_8e8 - (fVar141 + fVar43) * fVar126) * fStack_a60;
          auVar58._4_4_ =
               (fVar128 * (fVar112 + fVar130) - fStack_8f4 * (fVar79 + fVar135)) * fVar106 +
               (fStack_8f4 * (fVar142 + fVar56) - (fVar112 + fVar130) * fStack_8e4) * fStack_a90 +
               ((fVar79 + fVar135) * fStack_8e4 - (fVar142 + fVar56) * fVar128) * fStack_a60;
          auVar58._8_4_ =
               (fStack_a70 * (fVar113 + fVar131) - fStack_8f0 * (fVar81 + fVar136)) * fVar106 +
               (fStack_8f0 * (fVar143 + fVar67) - (fVar113 + fVar131) * fStack_8e0) * fStack_a90 +
               ((fVar81 + fVar136) * fStack_8e0 - (fVar143 + fVar67) * fStack_a70) * fStack_a60;
          auVar58._12_4_ =
               (fStack_a6c * (fVar71 + fVar132) - fStack_8ec * (fVar82 + fVar137)) * fVar106 +
               (fStack_8ec * (fVar54 + fVar69) - (fVar71 + fVar132) * fStack_8dc) * fStack_a90 +
               ((fVar82 + fVar137) * fStack_8dc - (fVar54 + fVar69) * fStack_a6c) * fStack_a60;
          local_8d8 = fVar44 + local_8c8 + auVar58._0_4_;
          fStack_8d4 = fVar64 + fStack_8c4 + auVar58._4_4_;
          fStack_8d0 = auVar49._8_4_ + fStack_8c0 + auVar58._8_4_;
          fStack_8cc = auVar49._12_4_ + fStack_8bc + auVar58._12_4_;
          auVar28._4_4_ = fStack_8c4;
          auVar28._0_4_ = local_8c8;
          auVar28._8_4_ = fStack_8c0;
          auVar28._12_4_ = fStack_8bc;
          auVar45 = minps(auVar49,auVar28);
          auVar45 = minps(auVar45,auVar58);
          auVar109._8_4_ = auVar49._8_4_;
          auVar109._0_8_ = auVar49._0_8_;
          auVar109._12_4_ = auVar49._12_4_;
          auVar29._4_4_ = fStack_8c4;
          auVar29._0_4_ = local_8c8;
          auVar29._8_4_ = fStack_8c0;
          auVar29._12_4_ = fStack_8bc;
          auVar74 = maxps(auVar109,auVar29);
          auVar74 = maxps(auVar74,auVar58);
          fVar54 = ABS(local_8d8) * 1.1920929e-07;
          fVar82 = ABS(fStack_8d4) * 1.1920929e-07;
          fVar71 = ABS(fStack_8d0) * 1.1920929e-07;
          fVar43 = ABS(fStack_8cc) * 1.1920929e-07;
          auVar110._4_4_ = -(uint)(auVar74._4_4_ <= fVar82);
          auVar110._0_4_ = -(uint)(auVar74._0_4_ <= fVar54);
          auVar110._8_4_ = -(uint)(auVar74._8_4_ <= fVar71);
          auVar110._12_4_ = -(uint)(auVar74._12_4_ <= fVar43);
          auVar50._4_4_ = -(uint)(-fVar82 <= auVar45._4_4_);
          auVar50._0_4_ = -(uint)(-fVar54 <= auVar45._0_4_);
          auVar50._8_4_ = -(uint)(-fVar71 <= auVar45._8_4_);
          auVar50._12_4_ = -(uint)(-fVar43 <= auVar45._12_4_);
          auVar110 = auVar110 | auVar50;
          local_a99 = 0;
          auVar111._0_4_ = auVar110._0_4_ & local_8b8._0_4_;
          auVar111._4_4_ = auVar110._4_4_ & local_8b8._4_4_;
          auVar111._8_4_ = auVar110._8_4_ & local_8b8._8_4_;
          auVar111._12_4_ = auVar110._12_4_ & local_8b8._12_4_;
          iVar32 = movmskps((int)lVar34,auVar111);
          local_a48 = pRVar39;
          local_a68 = pRVar40;
          local_9f8 = puVar38;
          local_a08 = uVar33;
          if (iVar32 != 0) {
            local_a78 = CONCAT44(fVar128,fVar126);
            auVar121._0_4_ = fVar85 * local_8f8 - fVar120 * fVar126;
            auVar121._4_4_ = fVar90 * fStack_8f4 - fVar122 * fVar128;
            auVar121._8_4_ = fStack_a40 * fStack_8f0 - fVar123 * fStack_a70;
            auVar121._12_4_ = fStack_a3c * fStack_8ec - fVar124 * fStack_a6c;
            auVar51._4_4_ = -(uint)(ABS(fStack_a24 * fVar90) < ABS(fVar122 * fVar128));
            auVar51._0_4_ = -(uint)(ABS(local_a28 * fVar85) < ABS(fVar120 * fVar126));
            auVar51._8_4_ = -(uint)(ABS(fStack_a20 * fStack_a40) < ABS(fVar123 * fStack_a70));
            auVar51._12_4_ = -(uint)(ABS(fStack_a1c * fStack_a3c) < ABS(fVar124 * fStack_a6c));
            auVar27._4_4_ = fVar127 * fVar122 - fStack_a24 * fVar90;
            auVar27._0_4_ = fVar125 * fVar120 - local_a28 * fVar85;
            auVar27._8_4_ = fStack_a30 * fVar123 - fStack_a20 * fStack_a40;
            auVar27._12_4_ = fStack_a2c * fVar124 - fStack_a1c * fStack_a3c;
            local_808 = blendvps(auVar121,auVar27,auVar51);
            auVar103._0_4_ = fVar120 * local_8e8 - fVar95 * local_8f8;
            auVar103._4_4_ = fVar122 * fStack_8e4 - fVar99 * fStack_8f4;
            auVar103._8_4_ = fVar123 * fStack_8e0 - fVar68 * fStack_8f0;
            auVar103._12_4_ = fVar124 * fStack_8dc - fVar70 * fStack_8ec;
            auVar52._4_4_ = -(uint)(ABS(fVar117 * fVar122) < ABS(fVar99 * fStack_8f4));
            auVar52._0_4_ = -(uint)(ABS(fVar114 * fVar120) < ABS(fVar95 * local_8f8));
            auVar52._8_4_ = -(uint)(ABS(fVar118 * fVar123) < ABS(fVar68 * fStack_8f0));
            auVar52._12_4_ = -(uint)(ABS(fVar119 * fVar124) < ABS(fVar70 * fStack_8ec));
            auVar26._4_4_ = fStack_a24 * fVar99 - fVar117 * fVar122;
            auVar26._0_4_ = local_a28 * fVar95 - fVar114 * fVar120;
            auVar26._8_4_ = fStack_a20 * fVar68 - fVar118 * fVar123;
            auVar26._12_4_ = fStack_a1c * fVar70 - fVar119 * fVar124;
            local_7f8 = blendvps(auVar103,auVar26,auVar52);
            auVar139._0_4_ = fVar95 * fVar126 - fVar85 * local_8e8;
            auVar139._4_4_ = fVar99 * fVar128 - fVar90 * fStack_8e4;
            auVar139._8_4_ = fVar68 * fStack_a70 - fStack_a40 * fStack_8e0;
            auVar139._12_4_ = fVar70 * fStack_a6c - fStack_a3c * fStack_8dc;
            auVar53._4_4_ = -(uint)(ABS(fVar127 * fVar99) < ABS(fVar90 * fStack_8e4));
            auVar53._0_4_ = -(uint)(ABS(fVar125 * fVar95) < ABS(fVar85 * local_8e8));
            auVar53._8_4_ = -(uint)(ABS(fStack_a30 * fVar68) < ABS(fStack_a40 * fStack_8e0));
            auVar53._12_4_ = -(uint)(ABS(fStack_a2c * fVar70) < ABS(fStack_a3c * fStack_8dc));
            auVar30._4_4_ = fVar117 * fVar90 - fVar127 * fVar99;
            auVar30._0_4_ = fVar114 * fVar85 - fVar125 * fVar95;
            auVar30._8_4_ = fVar118 * fStack_a40 - fStack_a30 * fVar68;
            auVar30._12_4_ = fVar119 * fStack_a3c - fStack_a2c * fVar70;
            local_7e8 = blendvps(auVar139,auVar30,auVar53);
            fVar54 = fVar106 * local_808._0_4_ +
                     fStack_a90 * local_7f8._0_4_ + fStack_a60 * local_7e8._0_4_;
            fVar82 = fVar106 * local_808._4_4_ +
                     fStack_a90 * local_7f8._4_4_ + fStack_a60 * local_7e8._4_4_;
            fVar71 = fVar106 * local_808._8_4_ +
                     fStack_a90 * local_7f8._8_4_ + fStack_a60 * local_7e8._8_4_;
            fVar106 = fVar106 * local_808._12_4_ +
                      fStack_a90 * local_7f8._12_4_ + fStack_a60 * local_7e8._12_4_;
            auVar115._0_4_ = fVar54 + fVar54;
            auVar115._4_4_ = fVar82 + fVar82;
            auVar115._8_4_ = fVar71 + fVar71;
            auVar115._12_4_ = fVar106 + fVar106;
            auVar59._0_4_ = fVar138 * local_7f8._0_4_ + fVar145 * local_7e8._0_4_;
            auVar59._4_4_ = fVar140 * local_7f8._4_4_ + fVar146 * local_7e8._4_4_;
            auVar59._8_4_ = fStack_a10 * local_7f8._8_4_ + fStack_9f0 * local_7e8._8_4_;
            auVar59._12_4_ = fStack_a0c * local_7f8._12_4_ + fStack_9ec * local_7e8._12_4_;
            fVar43 = fVar93 * local_808._0_4_ + auVar59._0_4_;
            fVar56 = fVar97 * local_808._4_4_ + auVar59._4_4_;
            fVar67 = fStack_a00 * local_808._8_4_ + auVar59._8_4_;
            fVar69 = fStack_9fc * local_808._12_4_ + auVar59._12_4_;
            auVar45 = rcpps(auVar59,auVar115);
            fVar54 = auVar45._0_4_;
            fVar82 = auVar45._4_4_;
            fVar71 = auVar45._8_4_;
            fVar106 = auVar45._12_4_;
            local_818._0_4_ =
                 ((1.0 - auVar115._0_4_ * fVar54) * fVar54 + fVar54) * (fVar43 + fVar43);
            local_818._4_4_ =
                 ((1.0 - auVar115._4_4_ * fVar82) * fVar82 + fVar82) * (fVar56 + fVar56);
            local_818._8_4_ =
                 ((1.0 - auVar115._8_4_ * fVar71) * fVar71 + fVar71) * (fVar67 + fVar67);
            local_818._12_4_ =
                 ((1.0 - auVar115._12_4_ * fVar106) * fVar106 + fVar106) * (fVar69 + fVar69);
            fVar54 = pRVar39->tfar;
            fVar82 = (pRVar39->org).field_0.m128[3];
            auVar116._0_4_ =
                 (int)((uint)(auVar115._0_4_ != 0.0 &&
                             (local_818._0_4_ <= fVar54 && fVar82 <= local_818._0_4_)) * -0x80000000
                      ) >> 0x1f;
            auVar116._4_4_ =
                 (int)((uint)(auVar115._4_4_ != 0.0 &&
                             (local_818._4_4_ <= fVar54 && fVar82 <= local_818._4_4_)) * -0x80000000
                      ) >> 0x1f;
            auVar116._8_4_ =
                 (int)((uint)(auVar115._8_4_ != 0.0 &&
                             (local_818._8_4_ <= fVar54 && fVar82 <= local_818._8_4_)) * -0x80000000
                      ) >> 0x1f;
            auVar116._12_4_ =
                 (int)((uint)(auVar115._12_4_ != 0.0 &&
                             (local_818._12_4_ <= fVar54 && fVar82 <= local_818._12_4_)) *
                      -0x80000000) >> 0x1f;
            uVar35 = movmskps(iVar32,auVar116 & auVar111);
            if (uVar35 != 0) {
              local_878._4_4_ = fStack_8c4;
              local_878._0_4_ = local_8c8;
              local_878._8_4_ = fStack_8c0;
              local_878._12_4_ = fStack_8bc;
              local_868._4_4_ = fStack_8d4;
              local_868._0_4_ = local_8d8;
              local_868._8_4_ = fStack_8d0;
              local_868._12_4_ = fStack_8cc;
              local_858 = &local_a99;
              local_848 = auVar116 & auVar111;
              auVar45 = rcpps(local_818,local_868);
              fVar54 = auVar45._0_4_;
              fVar82 = auVar45._4_4_;
              fVar71 = auVar45._8_4_;
              fVar106 = auVar45._12_4_;
              fVar54 = (float)(-(uint)(1e-18 <= ABS(local_8d8)) &
                              (uint)(((float)DAT_01f7ba10 - local_8d8 * fVar54) * fVar54 + fVar54));
              fVar82 = (float)(-(uint)(1e-18 <= ABS(fStack_8d4)) &
                              (uint)((DAT_01f7ba10._4_4_ - fStack_8d4 * fVar82) * fVar82 + fVar82));
              fVar71 = (float)(-(uint)(1e-18 <= ABS(fStack_8d0)) &
                              (uint)((DAT_01f7ba10._8_4_ - fStack_8d0 * fVar71) * fVar71 + fVar71));
              fVar106 = (float)(-(uint)(1e-18 <= ABS(fStack_8cc)) &
                               (uint)((DAT_01f7ba10._12_4_ - fStack_8cc * fVar106) * fVar106 +
                                     fVar106));
              auVar144._0_4_ = fVar44 * fVar54;
              auVar144._4_4_ = fVar64 * fVar82;
              auVar144._8_4_ = auVar49._8_4_ * fVar71;
              auVar144._12_4_ = auVar49._12_4_ * fVar106;
              local_838 = minps(auVar144,_DAT_01f7ba10);
              auVar134._0_4_ = fVar54 * local_8c8;
              auVar134._4_4_ = fVar82 * fStack_8c4;
              auVar134._8_4_ = fVar71 * fStack_8c0;
              auVar134._12_4_ = fVar106 * fStack_8bc;
              local_828 = minps(auVar134,_DAT_01f7ba10);
              local_a18 = (ulong)(uVar35 & 0xff);
              fStack_a8c = fStack_a90;
              do {
                local_a78 = 0;
                if (local_a18 != 0) {
                  for (; (local_a18 >> local_a78 & 1) == 0; local_a78 = local_a78 + 1) {
                  }
                }
                local_9c0 = *(uint *)((long)&local_898 + local_a78 * 4);
                local_a38 = (local_a50->geometries).items[local_9c0].ptr;
                if ((local_a38->mask & local_a48->mask) == 0) {
                  local_a18 = local_a18 ^ 1L << (local_a78 & 0x3f);
                }
                else {
                  local_a98 = local_a68->args;
                  if ((local_a98->filter == (RTCFilterFunctionN)0x0) &&
                     (local_a38->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_0022a8b6:
                    local_a48->tfar = -INFINITY;
                    return;
                  }
                  local_9a8.context = local_a68->user;
                  local_9d8 = *(undefined4 *)(local_808 + local_a78 * 4);
                  local_9d4 = *(undefined4 *)(local_7f8 + local_a78 * 4);
                  local_9d0 = *(undefined4 *)(local_7e8 + local_a78 * 4);
                  local_9cc = *(undefined4 *)(local_838 + local_a78 * 4);
                  local_9c8 = *(undefined4 *)(local_828 + local_a78 * 4);
                  local_9c4 = *(undefined4 *)((long)&local_8a8 + local_a78 * 4);
                  local_9bc = (local_9a8.context)->instID[0];
                  local_9b8 = (local_9a8.context)->instPrimID[0];
                  local_a28 = local_a48->tfar;
                  local_a48->tfar = *(float *)(local_818 + local_a78 * 4);
                  local_a7c = -1;
                  local_9a8.valid = &local_a7c;
                  local_9a8.geometryUserPtr = local_a38->userPtr;
                  local_9a8.hit = (RTCHitN *)&local_9d8;
                  local_9a8.N = 1;
                  local_9a8.ray = (RTCRayN *)local_a48;
                  if (((local_a38->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                      ((*local_a38->occlusionFilterN)(&local_9a8), *local_9a8.valid != 0)) &&
                     ((local_a98->filter == (RTCFilterFunctionN)0x0 ||
                      ((((local_a98->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                         RTC_RAY_QUERY_FLAG_INCOHERENT &&
                        (((local_a38->field_8).field_0x2 & 0x40) == 0)) ||
                       ((*local_a98->filter)(&local_9a8), *local_9a8.valid != 0))))))
                  goto LAB_0022a8b6;
                  local_a48->tfar = local_a28;
                  local_a18 = local_a18 ^ 1L << (local_a78 & 0x3f);
                }
              } while (local_a18 != 0);
            }
          }
          local_9e0 = local_9e0 + 1;
          pRVar39 = local_a48;
          pRVar40 = local_a68;
          puVar38 = local_9f8;
          uVar33 = local_a08;
        } while (local_9e0 != local_9e8);
      }
LAB_0022a8a6:
    } while (local_9f8 != &local_7d8);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }